

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

ProString * __thiscall
QHash<ProKey,_ProString>::value
          (ProString *__return_storage_ptr__,QHash<ProKey,_ProString> *this,ProKey *key)

{
  Node<ProKey,_ProString> *pNVar1;
  ProString *other;
  
  if (this->d != (Data<QHashPrivate::Node<ProKey,_ProString>_> *)0x0) {
    pNVar1 = QHashPrivate::Data<QHashPrivate::Node<ProKey,_ProString>_>::findNode<ProKey>
                       (this->d,key);
    if (pNVar1 != (Node<ProKey,_ProString> *)0x0) {
      other = &pNVar1->value;
      goto LAB_0010f0ef;
    }
  }
  other = (ProString *)0x0;
LAB_0010f0ef:
  if (other == (ProString *)0x0) {
    ProString::ProString(__return_storage_ptr__);
  }
  else {
    ProString::ProString(__return_storage_ptr__,other);
  }
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }